

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value_impl(robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    *this,size_t ibucket,distance_type dist_from_ideal_bucket,
                   truncated_hash_type hash,value_type *value)

{
  bool bVar1;
  distance_type dVar2;
  bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *this_00;
  undefined4 in_ECX;
  short in_DX;
  bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *in_RSI;
  value_type *in_RDI;
  bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *in_R8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined2 in_stack_ffffffffffffffec;
  
  bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::
  swap_with_value_in_bucket
            (in_RSI,(distance_type *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffec,in_ECX)),
             (truncated_hash_type *)in_R8,in_RDI);
  this_00 = (bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *)
            next_bucket<tsl::rh::power_of_two_growth_policy<2UL>,_nullptr>
                      ((robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                        *)in_RDI,(size_t)in_RSI);
  while( true ) {
    in_DX = in_DX + 1;
    bVar1 = bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::empty
                      ((bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *)
                       ((in_RDI->second).num_weight.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)this_00 * 0x20));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd4 = (int)in_DX;
    dVar2 = bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::
            dist_from_ideal_bucket
                      ((bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *)
                       ((in_RDI->second).num_weight.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)this_00 * 0x20));
    if (dVar2 < in_stack_ffffffffffffffd4) {
      if (0x2000 < in_DX) {
        *(undefined1 *)
         &(in_RDI->second).cat_sum.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
      }
      bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::
      swap_with_value_in_bucket
                (this_00,(distance_type *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffec,in_ECX))
                 ,(truncated_hash_type *)in_R8,in_RDI);
    }
    this_00 = (bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *)
              next_bucket<tsl::rh::power_of_two_growth_policy<2UL>,_nullptr>
                        ((robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                          *)in_RDI,(size_t)this_00);
  }
  bucket_entry<std::pair<unsigned_long,ImputedData<long,double>>,false>::
  set_value_of_empty_bucket<std::pair<unsigned_long,ImputedData<long,double>>>
            (in_R8,(distance_type)((ulong)in_RDI >> 0x30),(truncated_hash_type)in_RDI,
             (pair<unsigned_long,_ImputedData<long,_double>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void insert_value_impl(std::size_t ibucket,
                         distance_type dist_from_ideal_bucket,
                         truncated_hash_type hash, value_type& value) {
    tsl_rh_assert(dist_from_ideal_bucket >
                  m_buckets[ibucket].dist_from_ideal_bucket());
    m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket, hash,
                                                 value);
    ibucket = next_bucket(ibucket);
    dist_from_ideal_bucket++;

    while (!m_buckets[ibucket].empty()) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (dist_from_ideal_bucket >
            bucket_entry::DIST_FROM_IDEAL_BUCKET_LIMIT) {
          /**
           * The number of probes is really high, rehash the map on the next
           * insert. Difficult to do now as rehash may throw an exception.
           */
          m_grow_on_next_insert = true;
        }

        m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                     hash, value);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket, hash,
                                                 std::move(value));
  }